

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_type ggml_ftype_to_ggml_type(ggml_ftype ftype)

{
  bool bVar1;
  ulong uVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  
  uVar2 = 0x27;
  bVar1 = true;
  switch(ftype) {
  case GGML_FTYPE_ALL_F32:
  case GGML_FTYPE_MOSTLY_F16:
  case GGML_FTYPE_MOSTLY_Q4_0:
  case GGML_FTYPE_MOSTLY_Q4_1:
  case GGML_FTYPE_MOSTLY_Q2_K:
  case GGML_FTYPE_MOSTLY_Q3_K:
  case GGML_FTYPE_MOSTLY_Q4_K:
  case GGML_FTYPE_MOSTLY_Q5_K:
  case GGML_FTYPE_MOSTLY_Q6_K:
    bVar1 = false;
    uVar2 = (ulong)(uint)ftype;
  default:
    goto switchD_0011974b_caseD_4;
  case GGML_FTYPE_MOSTLY_Q8_0:
    uVar2 = 8;
    break;
  case GGML_FTYPE_MOSTLY_Q5_0:
    uVar2 = 6;
    break;
  case GGML_FTYPE_MOSTLY_Q5_1:
    uVar2 = 7;
    break;
  case GGML_FTYPE_MOSTLY_IQ2_XXS:
    uVar2 = 0x10;
    break;
  case GGML_FTYPE_MOSTLY_IQ2_XS:
    uVar2 = 0x11;
    break;
  case GGML_FTYPE_MOSTLY_IQ3_XXS:
    uVar2 = 0x12;
    break;
  case GGML_FTYPE_MOSTLY_IQ1_S:
    uVar2 = 0x13;
    break;
  case GGML_FTYPE_MOSTLY_IQ4_NL:
    uVar2 = 0x14;
    break;
  case GGML_FTYPE_MOSTLY_IQ3_S:
    uVar2 = 0x15;
    break;
  case GGML_FTYPE_MOSTLY_IQ2_S:
    uVar2 = 0x16;
    break;
  case GGML_FTYPE_MOSTLY_IQ4_XS:
    uVar2 = 0x17;
    break;
  case GGML_FTYPE_MOSTLY_IQ1_M:
    uVar2 = 0x1d;
    break;
  case GGML_FTYPE_MOSTLY_BF16:
    uVar2 = 0x1e;
  }
  bVar1 = false;
switchD_0011974b_caseD_4:
  if (!bVar1) {
    return (ggml_type)uVar2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
             ,0x50c,"GGML_ASSERT(%s) failed","wtype != GGML_TYPE_COUNT",in_R8,in_R9,uVar2);
}

Assistant:

enum ggml_type ggml_ftype_to_ggml_type(enum ggml_ftype ftype) {
    enum ggml_type wtype = GGML_TYPE_COUNT;

    switch (ftype) {
        case GGML_FTYPE_ALL_F32:              wtype = GGML_TYPE_F32;   break;
        case GGML_FTYPE_MOSTLY_F16:           wtype = GGML_TYPE_F16;   break;
        case GGML_FTYPE_MOSTLY_BF16:          wtype = GGML_TYPE_BF16;  break;
        case GGML_FTYPE_MOSTLY_Q4_0:          wtype = GGML_TYPE_Q4_0;  break;
        case GGML_FTYPE_MOSTLY_Q4_1:          wtype = GGML_TYPE_Q4_1;  break;
        case GGML_FTYPE_MOSTLY_Q5_0:          wtype = GGML_TYPE_Q5_0;  break;
        case GGML_FTYPE_MOSTLY_Q5_1:          wtype = GGML_TYPE_Q5_1;  break;
        case GGML_FTYPE_MOSTLY_Q8_0:          wtype = GGML_TYPE_Q8_0;  break;
        case GGML_FTYPE_MOSTLY_Q2_K:          wtype = GGML_TYPE_Q2_K;  break;
        case GGML_FTYPE_MOSTLY_Q3_K:          wtype = GGML_TYPE_Q3_K;  break;
        case GGML_FTYPE_MOSTLY_Q4_K:          wtype = GGML_TYPE_Q4_K;  break;
        case GGML_FTYPE_MOSTLY_Q5_K:          wtype = GGML_TYPE_Q5_K;  break;
        case GGML_FTYPE_MOSTLY_Q6_K:          wtype = GGML_TYPE_Q6_K;  break;
        case GGML_FTYPE_MOSTLY_IQ2_XXS:       wtype = GGML_TYPE_IQ2_XXS;  break;
        case GGML_FTYPE_MOSTLY_IQ2_XS:        wtype = GGML_TYPE_IQ2_XS;   break;
        case GGML_FTYPE_MOSTLY_IQ3_XXS:       wtype = GGML_TYPE_IQ3_XXS;  break;
        case GGML_FTYPE_MOSTLY_IQ1_S:         wtype = GGML_TYPE_IQ1_S;    break;
        case GGML_FTYPE_MOSTLY_IQ1_M:         wtype = GGML_TYPE_IQ1_M;    break;
        case GGML_FTYPE_MOSTLY_IQ4_NL:        wtype = GGML_TYPE_IQ4_NL;   break;
        case GGML_FTYPE_MOSTLY_IQ4_XS:        wtype = GGML_TYPE_IQ4_XS;   break;
        case GGML_FTYPE_MOSTLY_IQ3_S:         wtype = GGML_TYPE_IQ3_S;    break;
        case GGML_FTYPE_MOSTLY_IQ2_S:         wtype = GGML_TYPE_IQ2_S;    break;
        case GGML_FTYPE_UNKNOWN:              wtype = GGML_TYPE_COUNT; break;
        case GGML_FTYPE_MOSTLY_Q4_1_SOME_F16: wtype = GGML_TYPE_COUNT; break;
    }

    GGML_ASSERT(wtype != GGML_TYPE_COUNT);

    return wtype;
}